

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O3

bool woff2::GetGlyphData(Font *font,int glyph_index,uint8_t **glyph_data,size_t *glyph_size)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  _Base_ptr p_Var9;
  _Base_ptr *pp_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr *pp_Var13;
  uint uVar14;
  bool bVar16;
  ulong uVar15;
  
  if ((glyph_index < 0) ||
     (p_Var5 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var5 == (_Base_ptr)0x0)) {
    return false;
  }
  p_Var1 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = p_Var5;
  p_Var11 = &p_Var1->_M_header;
  do {
    bVar16 = p_Var9[1]._M_color < 0x68656164;
    if (!bVar16) {
      p_Var11 = p_Var9;
    }
    p_Var9 = (&p_Var9->_M_left)[bVar16];
  } while (p_Var9 != (_Base_ptr)0x0);
  p_Var9 = &p_Var1->_M_header;
  p_Var12 = p_Var5;
  if ((_Rb_tree_header *)p_Var11 == p_Var1) {
    pp_Var10 = (_Base_ptr *)0x0;
  }
  else {
    pp_Var10 = (_Base_ptr *)0x0;
    if (p_Var11[1]._M_color < 0x68656165) {
      pp_Var10 = &p_Var11[1]._M_parent;
    }
  }
  do {
    bVar16 = p_Var12[1]._M_color < 0x6c6f6361;
    if (!bVar16) {
      p_Var9 = p_Var12;
    }
    pp_Var13 = &p_Var12->_M_left;
    p_Var12 = pp_Var13[bVar16];
  } while (pp_Var13[bVar16] != (_Base_ptr)0x0);
  p_Var11 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    pp_Var13 = (_Base_ptr *)0x0;
  }
  else {
    pp_Var13 = (_Base_ptr *)0x0;
    if (p_Var9[1]._M_color < 0x6c6f6362) {
      pp_Var13 = &p_Var9[1]._M_parent;
    }
  }
  do {
    bVar16 = p_Var5[1]._M_color < 0x676c7966;
    if (!bVar16) {
      p_Var11 = p_Var5;
    }
    p_Var5 = (&p_Var5->_M_left)[bVar16];
  } while (p_Var5 != (_Base_ptr)0x0);
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    if (pp_Var10 == (_Base_ptr *)0x0) {
      return false;
    }
    if (pp_Var13 == (_Base_ptr *)0x0) {
      return false;
    }
    if (0x676c7966 < p_Var11[1]._M_color) {
      return false;
    }
    if (0x33 < *(uint *)((long)pp_Var10 + 0xc)) {
      iVar4 = IndexFormat(font);
      p_Var5 = pp_Var13[2];
      uVar7 = *(uint *)((long)pp_Var13 + 0xc);
      uVar6 = (ulong)uVar7;
      if (iVar4 == 0) {
        if (0x20000000 < (uint)glyph_index) {
          return false;
        }
        lVar2 = (ulong)(uint)glyph_index * 2;
        if (uVar7 < (uint)lVar2) {
          return false;
        }
        if ((lVar2 + 2U <= uVar6) && (lVar2 + 4U <= uVar6)) {
          uVar3 = *(ushort *)((long)&p_Var5->_M_color + lVar2);
          uVar8 = uVar3 << 8 | uVar3 >> 8;
          uVar3 = *(ushort *)((long)&p_Var5->_M_color + lVar2 + 2U);
          uVar3 = uVar3 << 8 | uVar3 >> 8;
          if ((uVar8 <= uVar3) &&
             ((uint)uVar3 + (uint)uVar3 <= *(uint *)((long)&p_Var11[1]._M_left + 4))) {
            *glyph_data = (uint8_t *)
                          ((long)&(p_Var11[1]._M_right)->_M_color +
                          (ulong)((uint)uVar8 + (uint)uVar8));
            uVar6 = (ulong)(int)(((uint)uVar3 - (uint)uVar8) * 2);
            goto LAB_00106ab5;
          }
        }
      }
      else {
        uVar14 = glyph_index << 2;
        uVar15 = (ulong)uVar14;
        if (0x40000000 < uVar14) {
          return false;
        }
        if (uVar7 < uVar14) {
          return false;
        }
        if ((uVar15 + 4 <= uVar6) && (uVar15 + 8 <= uVar6)) {
          uVar7 = *(uint *)((long)&p_Var5->_M_color + uVar15);
          uVar14 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar7 = *(uint *)(&p_Var5->field_0x4 + uVar15);
          uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar6 = (ulong)(uVar7 - uVar14);
          if ((uVar14 <= uVar7) && (uVar7 <= *(uint *)((long)&p_Var11[1]._M_left + 4))) {
            *glyph_data = (uint8_t *)((long)&(p_Var11[1]._M_right)->_M_color + (ulong)uVar14);
LAB_00106ab5:
            *glyph_size = uVar6;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool GetGlyphData(const Font& font, int glyph_index,
                  const uint8_t** glyph_data, size_t* glyph_size) {
  if (glyph_index < 0) {
    return FONT_COMPRESSION_FAILURE();
  }
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  const Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
  if (head_table == NULL || loca_table == NULL || glyf_table == NULL ||
      head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  int index_fmt = IndexFormat(font);

  Buffer loca_buf(loca_table->data, loca_table->length);
  if (index_fmt == 0) {
    uint16_t offset1, offset2;
    if (!loca_buf.Skip(2 * glyph_index) ||
        !loca_buf.ReadU16(&offset1) ||
        !loca_buf.ReadU16(&offset2) ||
        offset2 < offset1 ||
        2 * offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + 2 * offset1;
    *glyph_size = 2 * (offset2 - offset1);
  } else {
    uint32_t offset1, offset2;
    if (!loca_buf.Skip(4 * glyph_index) ||
        !loca_buf.ReadU32(&offset1) ||
        !loca_buf.ReadU32(&offset2) ||
        offset2 < offset1 ||
        offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + offset1;
    *glyph_size = offset2 - offset1;
  }
  return true;
}